

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::
ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
           *this)

{
  TextReader<fmt::Locale> *this_00;
  int index;
  char *pcVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double ub;
  double lb;
  VarHandler bh;
  VarHandler local_38;
  
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  iVar2 = **(int **)(this + 8);
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  ub = 0.0;
  lb = 0.0;
  local_38.
  super_ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::ItemType)0>
  .reader_ = (ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::ItemType)0>
              )(ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::ItemType)0>
                )this;
  do {
    if (iVar2 == index) {
      return;
    }
    this_00 = *(TextReader<fmt::Locale> **)this;
    pcVar1 = (this_00->super_ReaderBase).ptr_;
    (this_00->super_ReaderBase).token_ = pcVar1;
    (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
    dVar3 = -INFINITY;
    dVar4 = INFINITY;
    switch(*pcVar1) {
    case '0':
      dVar3 = TextReader<fmt::Locale>::ReadDouble(this_00);
      dVar4 = TextReader<fmt::Locale>::ReadDouble(*(TextReader<fmt::Locale> **)this);
      break;
    case '1':
      dVar4 = TextReader<fmt::Locale>::ReadDouble(this_00);
      dVar3 = -INFINITY;
      break;
    case '2':
      dVar3 = TextReader<fmt::Locale>::ReadDouble(this_00);
      dVar4 = INFINITY;
      break;
    case '3':
      break;
    case '4':
      dVar3 = TextReader<fmt::Locale>::ReadDouble(this_00);
      dVar4 = dVar3;
      break;
    case '5':
      pcVar1 = "COMPL bound type is invalid for variables";
      goto LAB_0032f246;
    default:
      pcVar1 = "expected bound";
LAB_0032f246:
      TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)pcVar1);
      dVar3 = lb;
      dVar4 = ub;
    }
    ub = dVar4;
    lb = dVar3;
    TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    ::VarHandler::SetBounds(&local_38,index,lb,ub);
    index = index + 1;
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::ReadBounds() {
  enum BoundType {
    RANGE,     // Both lower and upper bounds: l <= body <= u.
    UPPER,     // Only upper bound: body <= u.
    LOWER,     // Only lower bound: l <= body.
    FREE,      // No constraints on body (free variable or constraint).
    CONSTANT,  // Equal to constant: body = c.
    COMPL      // Body complements variable v[i - 1].
  };
  reader_.ReadTillEndOfLine();
  double lb = 0, ub = 0;
  BoundHandler bh(*this);
  int num_bounds = bh.num_items();
  double infinity = INFINITY;
  for (int i = 0; i < num_bounds; ++i) {
    switch (reader_.ReadChar() - '0') {
    case RANGE:
      lb = reader_.ReadDouble();
      ub = reader_.ReadDouble();
      break;
    case UPPER:
      lb = -infinity;
      ub = reader_.ReadDouble();
      break;
    case LOWER:
      lb = reader_.ReadDouble();
      ub = infinity;
      break;
    case FREE:
      lb = -infinity;
      ub =  infinity;
      break;
    case CONSTANT:
      lb = ub = reader_.ReadDouble();
      break;
    case COMPL:
      if (BoundHandler::TYPE == CON) {
        int flags = reader_.template ReadInt<int>();
        int var_index = reader_.ReadUInt();
        // Don't use NLReader::ReadUInt(int, int) as num_vars + 1 may overflow.
        if (var_index == 0 || var_index > header_.num_vars)
          reader_.ReportError("integer {} out of bounds", var_index);
        --var_index;
        int mask = ComplInfo::INF_LB | ComplInfo::INF_UB;
        handler_.OnComplementarity(i, var_index, ComplInfo(flags & mask));
        reader_.ReadTillEndOfLine();
        continue;
      }
      reader_.ReportError("COMPL bound type is invalid for variables");
      break;
    default:
      reader_.ReportError("expected bound");
    }
    reader_.ReadTillEndOfLine();
    bh.SetBounds(i, lb, ub);
  }
}